

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGhsMultiGenerator::WriteFileHeader(cmGlobalGhsMultiGenerator *this,ostream *fout)

{
  char cVar1;
  ostream *poVar2;
  long *plVar3;
  size_type __dnew;
  long *local_48;
  long local_40;
  long local_38 [2];
  long local_28;
  
  std::__ostream_insert<char,std::char_traits<char>>(fout,"#!gbuild",8);
  cVar1 = (char)fout;
  std::ios::widen((char)fout->_vptr_basic_ostream[-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(fout,"#",1);
  std::ios::widen((char)fout->_vptr_basic_ostream[-3] + cVar1);
  std::ostream::put(cVar1);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"# CMAKE generated file: DO NOT EDIT!",0x24);
  std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"# Generated by \"",0x10);
  local_28 = 0x11;
  local_48 = local_38;
  local_48 = (long *)std::__cxx11::string::_M_create((ulong *)&local_48,(ulong)&local_28);
  local_38[0] = local_28;
  *local_48 = 0x6948206e65657247;
  local_48[1] = 0x544c554d20736c6c;
  *(char *)(local_48 + 2) = 'I';
  local_40 = local_28;
  *(char *)((long)local_48 + local_28) = '\0';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_48,local_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," Generator, CMake Version ",0x1a);
  cmVersion::GetMajorVersion();
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".",1);
  cmVersion::GetMinorVersion();
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"#",1);
  std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
  std::ostream::put((char)poVar2);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteFileHeader(std::ostream& fout)
{
  fout << "#!gbuild" << std::endl;
  fout << "#" << std::endl
       << "# CMAKE generated file: DO NOT EDIT!" << std::endl
       << "# Generated by \"" << GetActualName() << "\""
       << " Generator, CMake Version " << cmVersion::GetMajorVersion() << "."
       << cmVersion::GetMinorVersion() << std::endl
       << "#" << std::endl
       << std::endl;
}